

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O1

bool_t prf_header_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint8_t uVar1;
  uint16_t uVar2;
  int16_t iVar3;
  int32_t iVar4;
  uint32_t uVar5;
  uint8_t *puVar6;
  uint len;
  bool_t bVar7;
  uint uVar8;
  float64_t fVar9;
  
  uVar2 = bf_get_uint16_be(bfile);
  node->opcode = uVar2;
  if (uVar2 == prf_header_info.opcode) {
    uVar2 = bf_get_uint16_be(bfile);
    node->length = uVar2;
    if ((4 < uVar2) && (node->data == (uint8_t *)0x0)) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        puVar6 = (uint8_t *)malloc((ulong)(uVar2 - 4) + 6);
      }
      else {
        puVar6 = (uint8_t *)pool_malloc(pool_id,uVar2 + 2);
      }
      node->data = puVar6;
      if (puVar6 == (uint8_t *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        uVar8 = 4;
        goto LAB_00106167;
      }
    }
    uVar8 = 4;
    if (0xb < node->length) {
      puVar6 = node->data;
      bf_read(bfile,puVar6,8);
      uVar8 = 0xc;
      if (0xf < node->length) {
        iVar4 = bf_get_int32_be(bfile);
        *(int32_t *)(puVar6 + 8) = iVar4;
        uVar8 = 0x10;
        if (0x13 < node->length) {
          iVar4 = bf_get_int32_be(bfile);
          *(int32_t *)(puVar6 + 0xc) = iVar4;
          uVar8 = 0x14;
          if (0x33 < node->length) {
            bf_read(bfile,puVar6 + 0x10,0x20);
            uVar8 = 0x34;
            if (0x35 < node->length) {
              iVar3 = bf_get_int16_be(bfile);
              *(int16_t *)(puVar6 + 0x30) = iVar3;
              uVar8 = 0x36;
              if (0x37 < node->length) {
                iVar3 = bf_get_int16_be(bfile);
                *(int16_t *)(puVar6 + 0x32) = iVar3;
                uVar8 = 0x38;
                if (0x39 < node->length) {
                  iVar3 = bf_get_int16_be(bfile);
                  *(int16_t *)(puVar6 + 0x34) = iVar3;
                  uVar8 = 0x3a;
                  if (0x3b < node->length) {
                    iVar3 = bf_get_int16_be(bfile);
                    *(int16_t *)(puVar6 + 0x36) = iVar3;
                    uVar8 = 0x3c;
                    if (0x3d < node->length) {
                      iVar3 = bf_get_int16_be(bfile);
                      *(int16_t *)(puVar6 + 0x38) = iVar3;
                      uVar8 = 0x3e;
                      if (0x3e < node->length) {
                        uVar1 = bf_get_int8(bfile);
                        puVar6[0x3a] = uVar1;
                        uVar8 = 0x3f;
                        if (0x3f < node->length) {
                          uVar1 = bf_get_int8(bfile);
                          puVar6[0x3b] = uVar1;
                          uVar8 = 0x40;
                          if (0x43 < node->length) {
                            uVar5 = bf_get_uint32_be(bfile);
                            *(uint32_t *)(puVar6 + 0x3c) = uVar5;
                            uVar8 = 0x44;
                            if (0x47 < node->length) {
                              iVar4 = bf_get_int32_be(bfile);
                              *(int32_t *)(puVar6 + 0x40) = iVar4;
                              uVar8 = 0x48;
                              if (0x4b < node->length) {
                                iVar4 = bf_get_int32_be(bfile);
                                *(int32_t *)(puVar6 + 0x44) = iVar4;
                                uVar8 = 0x4c;
                                if (0x4f < node->length) {
                                  iVar4 = bf_get_int32_be(bfile);
                                  *(int32_t *)(puVar6 + 0x48) = iVar4;
                                  uVar8 = 0x50;
                                  if (0x53 < node->length) {
                                    iVar4 = bf_get_int32_be(bfile);
                                    *(int32_t *)(puVar6 + 0x4c) = iVar4;
                                    uVar8 = 0x54;
                                    if (0x57 < node->length) {
                                      iVar4 = bf_get_int32_be(bfile);
                                      *(int32_t *)(puVar6 + 0x50) = iVar4;
                                      uVar8 = 0x58;
                                      if (0x5b < node->length) {
                                        iVar4 = bf_get_int32_be(bfile);
                                        *(int32_t *)(puVar6 + 0x54) = iVar4;
                                        uVar8 = 0x5c;
                                        if (0x5f < node->length) {
                                          iVar4 = bf_get_int32_be(bfile);
                                          *(int32_t *)(puVar6 + 0x58) = iVar4;
                                          uVar8 = 0x60;
                                          if (99 < node->length) {
                                            iVar4 = bf_get_int32_be(bfile);
                                            *(int32_t *)(puVar6 + 0x5c) = iVar4;
                                            uVar8 = 100;
                                            if (0x67 < node->length) {
                                              iVar4 = bf_get_int32_be(bfile);
                                              *(int32_t *)(puVar6 + 0x60) = iVar4;
                                              uVar8 = 0x68;
                                              if (0x6b < node->length) {
                                                iVar4 = bf_get_int32_be(bfile);
                                                *(int32_t *)(puVar6 + 100) = iVar4;
                                                uVar8 = 0x6c;
                                                if (0x6f < node->length) {
                                                  iVar4 = bf_get_int32_be(bfile);
                                                  *(int32_t *)(puVar6 + 0x68) = iVar4;
                                                  uVar8 = 0x70;
                                                  if (0x73 < node->length) {
                                                    iVar4 = bf_get_int32_be(bfile);
                                                    *(int32_t *)(puVar6 + 0x6c) = iVar4;
                                                    uVar8 = 0x74;
                                                    if (0x77 < node->length) {
                                                      iVar4 = bf_get_int32_be(bfile);
                                                      *(int32_t *)(puVar6 + 0x70) = iVar4;
                                                      uVar8 = 0x78;
                                                      if (0x7b < node->length) {
                                                        iVar4 = bf_get_int32_be(bfile);
                                                        *(int32_t *)(puVar6 + 0x74) = iVar4;
                                                        uVar8 = 0x7c;
                                                        if (0x7d < node->length) {
                                                          iVar3 = bf_get_int16_be(bfile);
                                                          *(int16_t *)(puVar6 + 0x78) = iVar3;
                                                          uVar8 = 0x7e;
                                                          if (0x7f < node->length) {
                                                            iVar3 = bf_get_int16_be(bfile);
                                                            *(int16_t *)(puVar6 + 0x7a) = iVar3;
                                                            if (iVar3 != 1) {
                                                              prf_warn(3,
                                                  "vertex storage type (%d) may not be supported\n",
                                                  (ulong)(uint)(int)iVar3);
                                                  }
                                                  uVar8 = 0x80;
                                                  if (0x83 < node->length) {
                                                    iVar4 = bf_get_int32_be(bfile);
                                                    *(int32_t *)(puVar6 + 0x7c) = iVar4;
                                                    uVar8 = 0x84;
                                                    if (0x8b < node->length) {
                                                      fVar9 = bf_get_float64_be(bfile);
                                                      *(float64_t *)(puVar6 + 0x80) = fVar9;
                                                      uVar8 = 0x8c;
                                                      if (0x93 < node->length) {
                                                        fVar9 = bf_get_float64_be(bfile);
                                                        *(float64_t *)(puVar6 + 0x88) = fVar9;
                                                        uVar8 = 0x94;
                                                        if (0x9b < node->length) {
                                                          fVar9 = bf_get_float64_be(bfile);
                                                          *(float64_t *)(puVar6 + 0x90) = fVar9;
                                                          uVar8 = 0x9c;
                                                          if (0xa3 < node->length) {
                                                            fVar9 = bf_get_float64_be(bfile);
                                                            *(float64_t *)(puVar6 + 0x98) = fVar9;
                                                            uVar8 = 0xa4;
                                                            if (0xa5 < node->length) {
                                                              iVar3 = bf_get_int16_be(bfile);
                                                              *(int16_t *)(puVar6 + 0xa0) = iVar3;
                                                              uVar8 = 0xa6;
                                                              if (0xa7 < node->length) {
                                                                iVar3 = bf_get_int16_be(bfile);
                                                                *(int16_t *)(puVar6 + 0xa2) = iVar3;
                                                                uVar8 = 0xa8;
                                                                if (0xab < node->length) {
                                                                  iVar4 = bf_get_int32_be(bfile);
                                                                  *(int32_t *)(puVar6 + 0xa4) =
                                                                       iVar4;
                                                                  uVar8 = 0xac;
                                                                  if (0xaf < node->length) {
                                                                    iVar4 = bf_get_int32_be(bfile);
                                                                    *(int32_t *)(puVar6 + 0xa8) =
                                                                         iVar4;
                                                                    uVar8 = 0xb0;
                                                                    if (0xb1 < node->length) {
                                                                      iVar3 = bf_get_int16_be(bfile)
                                                                      ;
                                                                      *(int16_t *)(puVar6 + 0xac) =
                                                                           iVar3;
                                                                      uVar8 = 0xb2;
                                                                      if (0xb3 < node->length) {
                                                                        iVar3 = bf_get_int16_be(
                                                  bfile);
                                                  *(int16_t *)(puVar6 + 0xae) = iVar3;
                                                  uVar8 = 0xb4;
                                                  if (0xb5 < node->length) {
                                                    iVar3 = bf_get_int16_be(bfile);
                                                    *(int16_t *)(puVar6 + 0xb0) = iVar3;
                                                    uVar8 = 0xb6;
                                                    if (0xb7 < node->length) {
                                                      iVar3 = bf_get_int16_be(bfile);
                                                      *(int16_t *)(puVar6 + 0xb2) = iVar3;
                                                      uVar8 = 0xb8;
                                                      if (0xbb < node->length) {
                                                        iVar4 = bf_get_int32_be(bfile);
                                                        *(int32_t *)(puVar6 + 0xb4) = iVar4;
                                                        uVar8 = 0xbc;
                                                        if (0xc3 < node->length) {
                                                          fVar9 = bf_get_float64_be(bfile);
                                                          *(float64_t *)(puVar6 + 0xb8) = fVar9;
                                                          uVar8 = 0xc4;
                                                          if (0xcb < node->length) {
                                                            fVar9 = bf_get_float64_be(bfile);
                                                            *(float64_t *)(puVar6 + 0xc0) = fVar9;
                                                            uVar8 = 0xcc;
                                                            if (0xd3 < node->length) {
                                                              fVar9 = bf_get_float64_be(bfile);
                                                              *(float64_t *)(puVar6 + 200) = fVar9;
                                                              uVar8 = 0xd4;
                                                              if (0xdb < node->length) {
                                                                fVar9 = bf_get_float64_be(bfile);
                                                                *(float64_t *)(puVar6 + 0xd0) =
                                                                     fVar9;
                                                                uVar8 = 0xdc;
                                                                if (0xe3 < node->length) {
                                                                  fVar9 = bf_get_float64_be(bfile);
                                                                  *(float64_t *)(puVar6 + 0xd8) =
                                                                       fVar9;
                                                                  uVar8 = 0xe4;
                                                                  if (0xeb < node->length) {
                                                                    fVar9 = bf_get_float64_be(bfile)
                                                                    ;
                                                                    *(float64_t *)(puVar6 + 0xe0) =
                                                                         fVar9;
                                                                    uVar8 = 0xec;
                                                                    if (0xf3 < node->length) {
                                                                      fVar9 = bf_get_float64_be(
                                                  bfile);
                                                  *(float64_t *)(puVar6 + 0xe8) = fVar9;
                                                  uVar8 = 0xf4;
                                                  if (0xfb < node->length) {
                                                    fVar9 = bf_get_float64_be(bfile);
                                                    *(float64_t *)(puVar6 + 0xf0) = fVar9;
                                                    uVar8 = 0xfc;
                                                    if (0xfd < node->length) {
                                                      iVar3 = bf_get_int16_be(bfile);
                                                      *(int16_t *)(puVar6 + 0xf8) = iVar3;
                                                      uVar8 = 0xfe;
                                                      if (0xff < node->length) {
                                                        iVar3 = bf_get_int16_be(bfile);
                                                        *(int16_t *)(puVar6 + 0xfa) = iVar3;
                                                        uVar8 = 0x100;
                                                        if (0x101 < node->length) {
                                                          iVar3 = bf_get_int16_be(bfile);
                                                          *(int16_t *)(puVar6 + 0xfc) = iVar3;
                                                          uVar8 = 0x102;
                                                          if (0x103 < node->length) {
                                                            iVar3 = bf_get_int16_be(bfile);
                                                            *(int16_t *)(puVar6 + 0xfe) = iVar3;
                                                            uVar8 = 0x104;
                                                            if (0x105 < node->length) {
                                                              iVar3 = bf_get_int16_be(bfile);
                                                              *(int16_t *)(puVar6 + 0x100) = iVar3;
                                                              uVar8 = 0x106;
                                                              if (0x107 < node->length) {
                                                                iVar3 = bf_get_int16_be(bfile);
                                                                *(int16_t *)(puVar6 + 0x102) = iVar3
                                                                ;
                                                                uVar8 = 0x108;
                                                                if (0x109 < node->length) {
                                                                  iVar3 = bf_get_int16_be(bfile);
                                                                  *(int16_t *)(puVar6 + 0x104) =
                                                                       iVar3;
                                                                  uVar8 = 0x10a;
                                                                  if (0x10b < node->length) {
                                                                    iVar3 = bf_get_int16_be(bfile);
                                                                    *(int16_t *)(puVar6 + 0x106) =
                                                                         iVar3;
                                                                    uVar8 = 0x10c;
                                                                    if (0x10f < node->length) {
                                                                      iVar4 = bf_get_int32_be(bfile)
                                                                      ;
                                                                      *(int32_t *)(puVar6 + 0x108) =
                                                                           iVar4;
                                                                      uVar8 = 0x110;
                                                                      if (0x111 < node->length) {
                                                                        iVar3 = bf_get_int16_be(
                                                  bfile);
                                                  *(int16_t *)(puVar6 + 0x10c) = iVar3;
                                                  uVar8 = 0x112;
                                                  if (0x113 < node->length) {
                                                    iVar3 = bf_get_int16_be(bfile);
                                                    *(int16_t *)(puVar6 + 0x10e) = iVar3;
                                                    uVar8 = 0x114;
                                                    if (0x115 < node->length) {
                                                      iVar3 = bf_get_int16_be(bfile);
                                                      *(int16_t *)(puVar6 + 0x110) = iVar3;
                                                      uVar8 = 0x116;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar7 = 1;
    len = node->length - uVar8;
    if (uVar8 <= node->length && len != 0) {
      bf_read(bfile,node->data + (ulong)uVar8 + 2,len);
    }
  }
  else {
    prf_error(9,"tried header load method for node of type %d.",(ulong)uVar2);
    uVar8 = 2;
LAB_00106167:
    bVar7 = 0;
    bf_rewind(bfile,uVar8);
  }
  return bVar7;
}

Assistant:

static
bool_t
prf_header_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    uint16_t pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );

    if ( node->opcode != prf_header_info.opcode ) {
        prf_error( 9, "tried header load method for node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );

    pos = 4;

    if ( (node->length > 4) && (node->data == NULL) ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    do {
        node_data * data;
        data = (node_data *) node->data;
        if ( node->length < (pos + 8) ) break;
        bf_read( bfile, (uint8_t *) data->id, 8 ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        data->format_revision_level = bf_get_int32_be( bfile ); pos += 4;
/*
        fprintf( stderr, "Open Flight revision level: %d\n",
            data->format_revision_level );
*/
        if ( node->length < (pos + 4) ) break;
        data->edit_revision_level = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 32) ) break;
        bf_read( bfile, (uint8_t *) data->date_and_time, 32 ); pos += 32;
        if ( node->length < (pos + 2) ) break;
        data->next_group = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_lod = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_object = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_face = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->unit_multiplier_divisor = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 1) ) break;
        data->vertex_coordinate_units = bf_get_int8( bfile ); pos += 1;
        if ( node->length < (pos + 1) ) break;
        data->texwhite = bf_get_int8( bfile ); pos += 1;
        if ( node->length < (pos + 4) ) break;
        data->flags = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[0] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[1] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[2] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[3] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[4] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[5] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->projection_type = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[0] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[1] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[2] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[3] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[4] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[5] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[6] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        data->next_dof = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->vertex_storage_type = bf_get_int16_be( bfile ); pos += 2;
        if ( data->vertex_storage_type != 1 ) {
            prf_warn( 3, "vertex storage type (%d) may not be supported\n",
                data->vertex_storage_type );
            /* bf_rewind( bfile, pos ); return FALSE; */
        }
        if ( node->length < (pos + 4) ) break;
        data->database_origin = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->southwest_database_x, bf_get_float64_be( bfile ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->southwest_database_y, bf_get_float64_be( bfile ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->delta_x, bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->delta_y, bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 2) ) break;
        data->next_sound = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_path = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        data->reserved3[0] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved3[1] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        data->next_clip = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_text = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_bsp = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_switch = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        data->reserved4 = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->southwest_corner_latitude,
            bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->southwest_corner_longitude,
            bf_get_float64_be( bfile )); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->northeast_corner_latitude,
            bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->northeast_corner_longitude,
            bf_get_float64_be( bfile )); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->origin_latitude, bf_get_float64_be( bfile ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->origin_longitude, bf_get_float64_be( bfile ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->lambert_upper_latitude,
            bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->lambert_lower_latitude,
            bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 2) ) break;
        data->next_light_source = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_light_point = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_road = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_cat = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved5 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved6 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved7 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved8 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        data->earth_ellipsoid_model = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        data->next_adaptive = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_curve = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved9 = bf_get_int16_be( bfile ); pos += 2;
    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}